

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O2

void mat4x4_rotate_Z(vec4 *Q,vec4 *M,float angle)

{
  float fVar1;
  float local_58;
  float local_54;
  float local_50 [3];
  float local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  fVar1 = sinf(angle);
  local_58 = cosf(angle);
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  local_50[2] = -fVar1;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0x3f800000;
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0x3f800000;
  local_54 = fVar1;
  local_44 = local_58;
  mat4x4_mul(Q,M,(vec4 *)&local_58);
  return;
}

Assistant:

static inline void mat4x4_rotate_Z(mat4x4 Q, mat4x4 M, float angle)
{
	float s = sinf(angle);
	float c = cosf(angle);
	mat4x4 R = {
		{   c,   s, 0.f, 0.f},
		{  -s,   c, 0.f, 0.f},
		{ 0.f, 0.f, 1.f, 0.f},
		{ 0.f, 0.f, 0.f, 1.f}
	};
	mat4x4_mul(Q, M, R);
}